

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

void __thiscall BitString::SetValue(BitString *this,uchar unusedBits,uchar *data,size_t cb)

{
  value_type vVar1;
  invalid_argument *this_00;
  reference pvVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  const_iterator local_40;
  size_t local_28;
  size_t cb_local;
  uchar *data_local;
  BitString *pBStack_10;
  uchar unusedBits_local;
  BitString *this_local;
  
  local_28 = cb;
  cb_local = (size_t)data;
  data_local._7_1_ = unusedBits;
  pBStack_10 = this;
  if (7 < unusedBits) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Too many unused bits");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->value);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->value,local_28 + 1);
  vVar1 = data_local._7_1_;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->value,0);
  *pvVar2 = vVar1;
  local_50._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->value);
  local_48 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_50,1);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_40,&local_48);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->value,local_40,
             (uchar *)cb_local,(uchar *)(cb_local + local_28));
  return;
}

Assistant:

void BitString::SetValue(unsigned char unusedBits, const unsigned char * data, size_t cb)
{
	// Behavior here is interesting - first char specifies how many trailing
	// bits aren't used

	if (unusedBits > 7)
		throw std::invalid_argument("Too many unused bits");

	value.clear();
	value.resize(cb + 1);
	value[0] = unusedBits;
	value.insert(value.begin() + 1, data, data + cb);
}